

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseConversionOperatorType(State *state)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  char *pcVar6;
  char *local_58;
  char *end_simple_prefixes;
  char *begin_simple_prefixes;
  ParseState copy;
  ComplexityGuard local_20;
  ComplexityGuard guard;
  State *state_local;
  
  guard.state_ = state;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_20,state);
  bVar5 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_20);
  if (bVar5) {
    state_local._7_1_ = false;
  }
  else {
    iVar1 = ((guard.state_)->parse_state).mangled_idx;
    iVar2 = ((guard.state_)->parse_state).out_cur_idx;
    iVar3 = ((guard.state_)->parse_state).prev_name_idx;
    uVar4 = *(undefined4 *)&((guard.state_)->parse_state).field_0xc;
    pcVar6 = RemainingInput(guard.state_);
    do {
      bVar5 = ParseCharClass(guard.state_,"OPRCGrVK");
    } while (bVar5);
    local_58 = RemainingInput(guard.state_);
    bVar5 = ParseType(guard.state_);
    if (bVar5) {
      while (pcVar6 != local_58) {
        switch(local_58[-1]) {
        case 'C':
          MaybeAppend(guard.state_," _Complex");
          break;
        case 'G':
          MaybeAppend(guard.state_," _Imaginary");
          break;
        case 'K':
          MaybeAppend(guard.state_," const");
          break;
        case 'O':
          MaybeAppend(guard.state_,"&&");
          break;
        case 'P':
          MaybeAppend(guard.state_,"*");
          break;
        case 'R':
          MaybeAppend(guard.state_,"&");
          break;
        case 'V':
          MaybeAppend(guard.state_," volatile");
          break;
        case 'r':
          MaybeAppend(guard.state_," restrict");
        }
        local_58 = local_58 + -1;
      }
      state_local._7_1_ = true;
    }
    else {
      ((guard.state_)->parse_state).mangled_idx = iVar1;
      ((guard.state_)->parse_state).out_cur_idx = iVar2;
      ((guard.state_)->parse_state).prev_name_idx = iVar3;
      *(undefined4 *)&((guard.state_)->parse_state).field_0xc = uVar4;
      state_local._7_1_ = false;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_20);
  return state_local._7_1_;
}

Assistant:

static bool ParseConversionOperatorType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // Scan pointers, const, and other easy mangling prefixes with postfix
  // demanglings.  Remember the range of input for later rescanning.
  //
  // See `ParseType` and the `switch` below for the meaning of each char.
  const char* begin_simple_prefixes = RemainingInput(state);
  while (ParseCharClass(state, "OPRCGrVK")) {}
  const char* end_simple_prefixes = RemainingInput(state);

  // Emit the base type first.
  if (!ParseType(state)) {
    state->parse_state = copy;
    return false;
  }

  // Then rescan the easy type combinators in reverse order to emit their
  // demanglings in the expected output order.
  while (begin_simple_prefixes != end_simple_prefixes) {
    switch (*--end_simple_prefixes) {
      case 'P':
        MaybeAppend(state, "*");
        break;
      case 'R':
        MaybeAppend(state, "&");
        break;
      case 'O':
        MaybeAppend(state, "&&");
        break;
      case 'C':
        MaybeAppend(state, " _Complex");
        break;
      case 'G':
        MaybeAppend(state, " _Imaginary");
        break;
      case 'r':
        MaybeAppend(state, " restrict");
        break;
      case 'V':
        MaybeAppend(state, " volatile");
        break;
      case 'K':
        MaybeAppend(state, " const");
        break;
    }
  }
  return true;
}